

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_read_private_key(picnic_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  uint diff_00;
  int iVar1;
  int iVar2;
  int iVar3;
  picnic_instance_t *ppVar4;
  ulong __n;
  ulong in_RDX;
  byte *in_RSI;
  void *in_RDI;
  int check;
  uint diff;
  size_t bytes_required;
  picnic_instance_t *instance;
  picnic_params_t param;
  int local_4;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == (byte *)0x0)) || (in_RDX == 0)) {
    local_4 = -1;
  }
  else {
    ppVar4 = picnic_instance_get((uint)*in_RSI);
    if (ppVar4 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      __n = (ulong)(int)((uint)ppVar4->input_output_size * 3 + 1);
      if (in_RDX < __n) {
        local_4 = -1;
      }
      else {
        if (((ppVar4->lowmc).n & 7) != 0) {
          diff_00 = (uint)ppVar4->input_output_size * 8 - (uint)(ppVar4->lowmc).n;
          iVar1 = check_padding_bits(in_RSI[(int)(uint)ppVar4->input_output_size],diff_00);
          iVar2 = check_padding_bits(in_RSI[(int)((uint)ppVar4->input_output_size * 2)],diff_00);
          iVar3 = check_padding_bits(in_RSI[(int)((uint)ppVar4->input_output_size * 3)],diff_00);
          if ((iVar1 != 0 || iVar2 != 0) || iVar3 != 0) {
            return -1;
          }
        }
        memcpy(in_RDI,in_RSI,__n);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_read_private_key(picnic_privatekey_t* key, const uint8_t* buf,
                                                      size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param       = buf[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const size_t bytes_required = 1 + 3 * instance->input_output_size;
  if (buflen < bytes_required) {
    return -1;
  }

#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_255_255_4)
  if (instance->lowmc.n & 0x7) {
    const unsigned int diff = instance->input_output_size * 8 - instance->lowmc.n;
    /* sanity check of public data: padding bits need to be 0 */
    const int check = check_padding_bits(buf[1 + instance->input_output_size - 1], diff) |
                      check_padding_bits(buf[1 + 2 * instance->input_output_size - 1], diff) |
                      check_padding_bits(buf[1 + 3 * instance->input_output_size - 1], diff);
    picnic_declassify(&check, sizeof(check));
    if (check) {
      return -1;
    }
  }
#endif

  memcpy(key->data, buf, bytes_required);
  return 0;
}